

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  byte *pbVar1;
  Arch AVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  Array<asmjit::v1_14::OperandSignature,_32UL> *pAVar7;
  bool bVar8;
  Error EVar9;
  uint uVar10;
  Error EVar11;
  RegMask RVar12;
  OperandSignature *pOVar13;
  WorkData *pWVar14;
  InstHints *pIVar15;
  WorkData *pWVar16;
  uint uVar17;
  Error EVar18;
  int iVar19;
  long lVar20;
  RegMask RVar21;
  uint8_t *puVar22;
  Signature SVar23;
  uint32_t uVar24;
  BaseReg *index;
  uint uVar25;
  undefined1 uVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  RegGroup local_601;
  ulong local_600;
  BaseReg dstReg;
  uint32_t local_5d8;
  uint local_5d4;
  long local_5d0;
  ulong local_5c8;
  ulong local_5c0;
  WorkData *local_5b8;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_5b0;
  WorkData *local_5a8;
  RegGroup outGroup;
  undefined3 uStack_59f;
  uint32_t local_59c;
  uint32_t local_598;
  uint32_t local_594;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_590;
  WorkData *local_588;
  BaseReg *local_580;
  FuncFrame *local_578;
  ulong local_570;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  AVar2 = frame->_arch;
  constraints._availableRegs._data[0] = 0;
  constraints._availableRegs._data[1] = 0;
  constraints._availableRegs._data[2] = 0;
  constraints._availableRegs._data[3] = 0;
  local_5a8 = (WorkData *)this;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar9 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)AVar2);
  if (EVar9 != 0) {
    return EVar9;
  }
  EVar9 = FuncArgsContext::initWorkData(&ctx,frame,args,&constraints);
  puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
  if (EVar9 != 0) {
    return EVar9;
  }
  lVar20 = (ulong)AVar2 * 0xd8;
  local_5c0 = (ulong)ctx._varCount;
  local_570 = (ulong)ctx._saVarId;
  bVar3 = _archTraits[lVar20];
  local_5c8 = (ulong)bVar3;
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
      if (ctx._saVarId < ctx._varCount) {
        local_5c8 = (ulong)*(byte *)((long)&ctx._vars[local_570].cur._data + 2);
      }
      else {
        local_5c8 = (ulong)frame->_saRegId;
      }
    }
    else {
      local_5c8 = (ulong)(byte)_archTraits[lVar20 + 1];
    }
  }
  uVar25 = *(uint *)(*(long *)&local_5a8->_usedRegs + 0x50);
  local_580 = (BaseReg *)(ulong)uVar25;
  EVar9 = 0;
  local_578 = frame;
  if (ctx._stackDstMask != '\0') {
    uVar27 = (ulong)(frame->_dirtyRegs)._data[(ulong)((uint)local_5c8 != (uint)frame->_spRegId) - 3]
    ;
    uVar25 = uVar25 & 0xf8;
    pWVar14 = (WorkData *)(ulong)uVar25;
    uVar24 = uVar25 + 2;
    local_5b8 = (WorkData *)(local_5c8 << 0x20 | uVar27);
    local_588 = (WorkData *)
                CONCAT44(local_588._4_4_,(uint)((AVar2 & k32BitMask) == kUnknown) * 4 + 4);
    local_590 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar20 + 0x14);
    local_5b0 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)CONCAT44(local_5b0._4_4_,uVar24);
    local_600 = uVar27;
    for (uVar28 = 0; pAVar7 = local_590, bVar29 = 8, local_5c0 != uVar28; uVar28 = uVar28 + 1) {
      uVar17 = ctx._vars[uVar28].out._data;
      if ((uVar17 >> 9 & 1) != 0) {
        uVar10 = ctx._vars[uVar28].cur._data;
        if ((uVar10 & 0x300) == 0) {
LAB_0011dc63:
          local_59c = (uint32_t)((ulong)puVar22 >> 0x20);
          local_594 = (uint32_t)puVar22;
          emitArgsAssignment();
          if (uVar24 - 1 < 2) {
            RVar12 = 0xff;
            uVar25 = 0xffff;
            if ((char)uVar24 == '\x01') {
              uVar25 = 0xff;
            }
            RVar21 = uVar25 & 0xffffffef;
          }
          else {
            if (uVar24 != 6) {
              return 4;
            }
            RVar12 = 0;
            uVar25 = 0xffffffff;
            RVar21 = 0x7ffbffff;
          }
          pWVar14->_archRegs = RVar21;
          pWVar14->_workRegs = uVar25;
          pWVar14->_usedRegs = RVar12;
          pWVar14->_assignedRegs = RVar12;
          return 0;
        }
        dstReg.super_Operand.super_Operand_._signature._bits = 1;
        dstReg.super_Operand.super_Operand_._baseId = 0xff;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        local_5d4 = (uint)bVar3;
        local_5d0 = (ulong)(uint)((int)uVar17 >> 0xc) << 0x20;
        if (uVar25 == 0) {
          local_5d4 = ((int)uVar17 >> 0x1f) + local_5d4;
        }
        local_598 = 0;
        if (uVar25 == 0) {
          puVar22 = local_5b8->_reserved + (long)((int)uVar10 >> 0xc) + -0x1b;
        }
        else {
          puVar22 = (uint8_t *)CONCAT44((int)local_5c8,((int)uVar10 >> 0xc) + (int)uVar27);
        }
        local_59c = (uint32_t)((ulong)puVar22 >> 0x20);
        local_594 = (uint32_t)puVar22;
        local_5d8 = uVar24;
        _outGroup = uVar24;
        if ((uVar10 >> 10 & 1) == 0) {
LAB_0011d32d:
          if ((uVar10 & 0x500) == 0x100) {
            local_601 = (RegGroup)(uVar10 >> 0x18);
            pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>(local_590,&local_601);
            local_601 = *(RegGroup *)((long)&pOVar13->_bits + 1) & kMaxValue;
            pWVar16 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                      operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_601);
            uVar17 = ctx._vars[uVar28].cur._data;
            uVar10 = uVar17 >> 0x10;
            local_601 = (RegGroup)(uVar17 >> 0x18);
            pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>(pAVar7,&local_601);
            uVar27 = local_600;
            dstReg.super_Operand.super_Operand_._0_8_ =
                 CONCAT44(uVar10,pOVar13->_bits) & 0xffffffffff;
            FuncArgsContext::WorkData::unassign(pWVar16,(uint32_t)uVar28,uVar10 & 0xff);
          }
          else {
            bVar29 = TypeUtils::_typeData[((ulong)uVar10 & 0xff) + 0x100];
            if ((byte)TypeUtils::_typeData[((ulong)uVar10 & 0xff) + 0x100] <
                (byte)TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100]) {
              bVar29 = TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100];
            }
            if (((uint)local_588 < bVar29) &&
               ((9 < (byte)((char)uVar17 - 0x20U) || (9 < (byte)((char)uVar10 - 0x20U))))) {
              if ((((8 < bVar29) ||
                   (SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x40), SVar23._bits == 0))
                  && ((0x10 < bVar29 ||
                      (SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x44), SVar23._bits == 0)
                      ))) &&
                 (((0x20 < bVar29 ||
                   (SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x48), SVar23._bits == 0))
                  && (SVar23._bits = 0, bVar29 < 0x41)))) {
                SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x4c);
              }
            }
            else if (bVar29 < 5) {
              SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x2c);
            }
            else {
              SVar23._bits = *(uint32_t *)(_archTraits + lVar20 + 0x30);
            }
            if (SVar23._bits == 0) {
              bVar8 = false;
              EVar9 = 3;
            }
            else {
              local_601 = (RegGroup)(SVar23._bits >> 8) & kMaxValue;
              pWVar16 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                        operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_601);
              uVar17 = ~pWVar16->_assignedRegs & pWVar16->_workRegs;
              if (uVar17 == 0) {
                bVar8 = false;
                EVar9 = 3;
              }
              else {
                dstReg.super_Operand.super_Operand_._baseId = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                      dstReg.super_Operand.super_Operand_._baseId =
                           dstReg.super_Operand.super_Operand_._baseId + 1) {
                  }
                }
                dstReg.super_Operand.super_Operand_._signature._bits = SVar23._bits;
                EVar11 = (**(code **)(*(long *)local_5a8 + 0x20))
                                   (local_5a8,&dstReg,(char)ctx._vars[uVar28].out._data,&outGroup,
                                    (char)ctx._vars[uVar28].cur._data,0);
                bVar8 = EVar11 == 0;
                if (!bVar8) {
                  EVar9 = EVar11;
                }
              }
            }
            puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
            bVar29 = true;
            EVar11 = EVar9;
            if (!bVar8) goto LAB_0011d534;
          }
          if ((~ctx._vars[uVar28].cur._data & 0x500) == 0) {
            local_601 = k0;
            pWVar16 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                      operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_601);
            FuncArgsContext::WorkData::unassign
                      (pWVar16,(uint32_t)uVar28,
                       (uint)*(byte *)((long)&ctx._vars[uVar28].cur._data + 2));
          }
          EVar11 = (**(code **)(*(long *)local_5a8 + 0x10))
                             (local_5a8,&local_5d8,&dstReg,(char)ctx._vars[uVar28].cur._data,0);
          puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
          bVar29 = EVar11 != 0;
          if (!(bool)bVar29) {
            pbVar1 = (byte *)((long)&ctx._vars[uVar28].cur._data + 1);
            *pbVar1 = *pbVar1 | 8;
            EVar11 = EVar9;
          }
        }
        else {
          bVar29 = true;
          EVar11 = 0x19;
          if ((uVar10 >> 9 & 1) == 0) {
            local_59c = uVar10 >> 0x10 & 0xff;
            goto LAB_0011d32d;
          }
        }
LAB_0011d534:
        uVar24 = (uint32_t)local_5b0;
        EVar9 = EVar11;
      }
      if ((bVar29 & 7) != 0) goto LAB_0011d5b7;
    }
    bVar29 = 6;
LAB_0011d5b7:
    if ((bVar29 != 6) && (bVar29 != 0)) {
      return EVar9;
    }
  }
  local_5b0 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar20 + 0x14);
  local_600 = 0;
  uVar27 = local_5c0;
  do {
    uVar28 = 0;
    while( true ) {
      pAVar7 = local_5b0;
      local_59c = (uint32_t)((ulong)puVar22 >> 0x20);
      local_594 = (uint32_t)puVar22;
      if (uVar27 == uVar28) break;
      uVar25 = ctx._vars[uVar28].cur._data;
      if ((uVar25 & 0x900) == 0x100) {
        dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)(uVar25 >> 0x18);
        pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(local_5b0,(RegType *)&dstReg);
        bVar3 = *(byte *)((long)&pOVar13->_bits + 1);
        dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
             *(undefined1 *)((long)&ctx._vars[uVar28].out._data + 3);
        pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(pAVar7,(RegType *)&dstReg);
        bVar29 = *(byte *)((long)&pOVar13->_bits + 1);
        _outGroup = CONCAT31(uStack_59f,bVar29) & 0xffffff0f;
        iVar19 = 1;
        if ((bVar3 & 0xf) == (bVar29 & 0xf)) {
          bVar29 = *(byte *)((long)&ctx._vars[uVar28].cur._data + 2);
          bVar4 = *(byte *)((long)&ctx._vars[uVar28].out._data + 2);
          uVar25 = (uint)bVar4;
          pWVar14 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&outGroup);
          bVar8 = FuncArgsContext::WorkData::isAssigned(pWVar14,(uint)bVar4);
          uVar17 = (uint)bVar29;
          local_5b8 = pWVar14;
          if (((uint)bVar29 != (uint)bVar4) && (bVar8)) {
            bVar5 = pWVar14->_physToVarId[bVar4];
            uVar25 = ctx._vars[bVar5].out._data;
            if ((uVar25 == 0) ||
               (((uVar25 >> 8 & 1) != 0 && ((uVar25 >> 0x10 & 0xff) == (uint)bVar29)))) {
              dstReg.super_Operand.super_Operand_._0_8_ =
                   CONCAT71(dstReg.super_Operand.super_Operand_._1_7_,bVar3) & 0xffffffffffffff0f;
              pIVar15 = Support::Array<asmjit::v1_14::InstHints,_4UL>::
                        operator[]<asmjit::v1_14::RegGroup>
                                  ((Array<asmjit::v1_14::InstHints,_4UL> *)
                                   (_archTraits + lVar20 + 0x10),(RegGroup *)&dstReg);
              if ((*pIVar15 & kRegSwap) == kNoHints) {
                EVar18 = ~local_5b8->_assignedRegs & local_5b8->_workRegs;
                if (EVar18 == 0) {
                  local_600 = (ulong)((uint)local_600 | 2);
                  iVar19 = 0;
                  uVar25 = (uint)bVar4;
                }
                else {
                  uVar10 = ~local_5b8->_dstRegs & EVar18;
                  if (uVar10 == 0) {
                    uVar10 = EVar18;
                  }
                  uVar25 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  iVar19 = 0x14;
                }
              }
              else {
                bVar3 = *(byte *)((long)&ctx._vars[bVar5].cur._data + 3);
                uVar10 = (uint)*(byte *)((long)&ctx._vars[uVar28].cur._data + 3);
                uVar25 = (uint)bVar3;
                if (bVar3 < uVar10) {
                  uVar25 = uVar10;
                }
                if (uVar25 - 3 < 3) {
                  uVar25 = 6;
                }
                dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)uVar25;
                pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                          operator[]<asmjit::v1_14::RegType>(local_5b0,(RegType *)&dstReg);
                local_5d8 = pOVar13->_bits;
                dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar4;
                dstReg.super_Operand.super_Operand_._signature._bits = local_5d8;
                dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
                dstReg.super_Operand.super_Operand_._data[0] = 0;
                dstReg.super_Operand.super_Operand_._data[1] = 0;
                local_5d0 = 0;
                local_5d4 = uVar17;
                EVar18 = (**(code **)(*(long *)local_5a8 + 0x18))(local_5a8,&dstReg,&local_5d8,0);
                EVar11 = EVar18;
                if (EVar18 == 0) {
                  FuncArgsContext::WorkData::swap
                            (local_5b8,(uint32_t)uVar28,uVar17,(uint)bVar5,(uint)bVar4);
                  ctx._vars[uVar28].cur._data =
                       (uint)bVar4 * 0x10000 + (ctx._vars[uVar28].cur._data & 0xff00f7ff) + 0x800;
                  uVar25 = ctx._vars[bVar5].cur._data & 0xff00ffff | (uint)bVar29 << 0x10;
                  ctx._vars[bVar5].cur._data = uVar25;
                  if (ctx._vars[bVar5].out._data != 0) {
                    ctx._vars[bVar5].cur._data = uVar25 | 0x800;
                  }
                  local_600 = (ulong)((uint)local_600 | 1);
                  EVar11 = EVar9;
                }
                iVar19 = 1;
                uVar25 = (uint)bVar4;
                EVar9 = EVar11;
              }
              if (EVar18 == 0) goto LAB_0011d74a;
            }
            else {
              local_600 = (ulong)((uint)local_600 | 2);
              uVar25 = (uint)bVar4;
LAB_0011d74a:
              iVar19 = 0;
            }
            uVar27 = local_5c0;
            if (iVar19 != 0x14) goto LAB_0011d859;
          }
          pAVar7 = local_5b0;
          dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
               *(undefined1 *)((long)&ctx._vars[uVar28].out._data + 3);
          pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(local_5b0,(RegType *)&dstReg);
          dstReg.super_Operand.super_Operand_._baseId = uVar25;
          dstReg.super_Operand.super_Operand_._signature._bits = pOVar13->_bits;
          dstReg.super_Operand.super_Operand_._data[0] = 0;
          dstReg.super_Operand.super_Operand_._data[1] = 0;
          uVar24 = ctx._vars[uVar28].out._data;
          local_5d8 = CONCAT31(local_5d8._1_3_,
                               *(undefined1 *)((long)&ctx._vars[uVar28].cur._data + 3));
          pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(pAVar7,(RegType *)&local_5d8);
          local_5d8 = pOVar13->_bits;
          local_5d0 = 0;
          local_5d4 = (uint)bVar29;
          EVar11 = (**(code **)(*(long *)local_5a8 + 0x20))
                             (local_5a8,&dstReg,(char)uVar24,&local_5d8,
                              (char)ctx._vars[uVar28].cur._data,0);
          if (EVar11 == 0) {
            if (uVar17 != uVar25) {
              FuncArgsContext::WorkData::reassign(local_5b8,(uint32_t)uVar28,uVar25,uVar17);
            }
            uVar17 = ctx._vars[uVar28].out._data;
            ctx._vars[uVar28].cur._data =
                 (uint)(uVar25 == (uVar17 >> 0x10 & 0xff)) * 0x800 +
                 (uVar17 & 0xff0000ff | uVar25 << 0x10) + 0x100;
            local_600 = (ulong)((uint)local_600 | 3);
            iVar19 = 0;
            uVar27 = local_5c0;
          }
          else {
            iVar19 = 1;
            uVar27 = local_5c0;
            EVar9 = EVar11;
          }
        }
        else {
          EVar9 = 0x19;
        }
LAB_0011d859:
        puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
      }
      else {
        iVar19 = 0x13;
      }
      if ((iVar19 != 0x13) && (iVar19 != 0)) break;
      uVar28 = uVar28 + 1;
    }
    if (uVar28 < uVar27) {
      return EVar9;
    }
    if ((local_600 & 2) == 0) {
      if (ctx._hasStackSrc != true) goto LAB_0011dc57;
      if ((local_578->_minDynamicAlignment <= local_578->_finalStackAlignment) &&
         ((local_578->_attributes & kHasPreservedFP) == kNoAttributes)) {
        if ((uint)local_570 < (uint)uVar27) {
          bVar3 = *(byte *)((long)&ctx._vars[local_570 & 0xffffffff].cur._data + 2);
        }
        else {
          bVar3 = local_578->_saRegId;
        }
        local_5c8 = (ulong)bVar3;
      }
      local_5b8 = (WorkData *)
                  (ulong)(local_578->_dirtyRegs)._data
                         [(ulong)((uint)local_5c8 != (uint)local_578->_spRegId) - 3];
      uVar25 = (uint)local_580 & 0xf8;
      index = (BaseReg *)(ulong)uVar25;
      local_590 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)
                  (local_5c8 << 0x20 | (ulong)local_5b8);
      pWVar14 = (WorkData *)0x0;
      local_600 = CONCAT44(local_600._4_4_,1);
      local_580 = index;
      break;
    }
    if (((uint)local_600 & 5) == 4) {
      return 3;
    }
    local_600 = (ulong)((~(uint)local_600 & 1) << 2);
  } while( true );
  do {
    if ((uint)local_600 <= (uint)pWVar14) {
      iVar19 = 0x19;
      break;
    }
    uVar28 = 0;
    local_588 = pWVar14;
    while( true ) {
      local_59c = (uint32_t)((ulong)puVar22 >> 0x20);
      local_594 = (uint32_t)puVar22;
      uVar24 = (uint32_t)index;
      if (uVar27 == uVar28) break;
      uVar17 = ctx._vars[uVar28].cur._data;
      if ((uVar17 >> 0xb & 1) == 0) {
        iVar19 = 0;
        if ((uVar17 >> 9 & 1) != 0) {
          uVar17 = ctx._vars[uVar28].out._data;
          if ((uVar17 >> 8 & 1) == 0) {
            emitArgsAssignment();
            puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
            goto LAB_0011dc63;
          }
          uVar10 = uVar17 >> 0x10 & 0xff;
          uVar26 = (undefined1)(uVar17 >> 0x18);
          dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = uVar26;
          pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(local_5b0,(RegType *)&dstReg);
          _outGroup = CONCAT31(uStack_59f,*(undefined1 *)((long)&pOVar13->_bits + 1)) & 0xffffff0f;
          pWVar14 = ctx._workData._data;
          index = (BaseReg *)&outGroup;
          pWVar16 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>
                              ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)pWVar14,
                               (RegGroup *)index);
          if ((uVar10 == (uint)local_5c8) && (outGroup == k0)) {
            if ((uint)local_600 != 1) {
              FuncArgsContext::WorkData::unassign
                        (pWVar16,(uint)pWVar16->_physToVarId[uVar10],uVar10);
              goto LAB_0011db35;
            }
            local_600 = CONCAT44(local_600._4_4_,2);
            iVar19 = 0x1e;
            EVar11 = EVar9;
          }
          else {
LAB_0011db35:
            pOVar13 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>(local_5b0,(RegType *)&dstReg);
            dstReg.super_Operand.super_Operand_._0_8_ =
                 CONCAT44(uVar17 >> 0x10,pOVar13->_bits) & 0xffffffffff;
            dstReg.super_Operand.super_Operand_._data[0] = 0;
            dstReg.super_Operand.super_Operand_._data[1] = 0;
            uVar6 = ctx._vars[uVar28].cur._data;
            iVar19 = (int)uVar6 >> 0xc;
            if ((int)local_580 == 0) {
              local_5d0 = (long)&local_590->_data[0]._bits + (long)iVar19;
            }
            else {
              local_5d0 = CONCAT44((int)local_5c8,iVar19 + (int)local_5b8);
            }
            local_5d4 = (uint)((ulong)local_5d0 >> 0x20);
            local_5d0 = local_5d0 << 0x20;
            index = &dstReg;
            pWVar14 = local_5a8;
            local_5d8 = uVar25 + 2;
            EVar11 = (**(code **)(*(long *)local_5a8 + 0x20))
                               (local_5a8,index,(char)ctx._vars[uVar28].out._data,&local_5d8,
                                uVar6 & 0xff,0);
            iVar19 = 1;
            if (EVar11 == 0) {
              index = (BaseReg *)(uVar28 & 0xffffffff);
              FuncArgsContext::WorkData::assign(pWVar16,(uint32_t)uVar28,uVar10);
              ctx._vars[uVar28].cur._data =
                   (uint)(byte)ctx._vars[uVar28].cur._data + (uVar10 << 0x10 | uVar17 & 0xff000000)
                   + 0x900;
              iVar19 = 0;
              pWVar14 = pWVar16;
              EVar11 = EVar9;
            }
          }
          puVar22 = (uint8_t *)CONCAT44(local_59c,local_594);
          uVar27 = local_5c0;
          EVar9 = EVar11;
        }
      }
      else {
        iVar19 = 0x1e;
      }
      if ((iVar19 != 0x1e) && (iVar19 != 0)) goto LAB_0011dc2e;
      uVar28 = uVar28 + 1;
    }
    iVar19 = 0x1c;
LAB_0011dc2e:
    pWVar14 = (WorkData *)(ulong)((int)local_588 + 1);
  } while (iVar19 == 0x1c);
  if ((iVar19 == 0x19) || (iVar19 == 0)) {
LAB_0011dc57:
    EVar9 = 0;
  }
  return EVar9;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  Arch arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  auto& workData = ctx._workData;
  uint32_t varCount = ctx._varCount;
  uint32_t saVarId = ctx._saVarId;

  BaseReg sp = BaseReg(_emitter->_gpSignature, archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t regId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), regId);
        wd.unassign(varId, regId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which register to use. In general
        // we follow the rule that IntToInt moves will use GP regs with possibility to signature or zero extend,
        // and all other moves will either use GP or VEC regs depending on the size of the move.
        OperandSignature signature = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!signature.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[signature.regGroup()];
        RegMask availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t availableId = Support::ctz(availableRegs);
        reg.setSignatureAndId(signature, availableId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[RegGroup::kGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // Shuffle all registers that are currently assigned accordingly to target assignment.

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      RegGroup curGroup = archTraits.regTypeToGroup(cur.regType());
      RegGroup outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId) || curId == outId) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          // Only reassign if this is not a sign/zero extension that happens on the same in/out register.
          if (curId != outId)
            wd.reassign(varId, outId, curId);

          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasInstRegSwap(curGroup)) {
              RegType highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween(highestType, RegType::kGp8Lo, RegType::kGp16))
                highestType = RegType::kGp32;

              OperandSignature signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg(signature, outId), BaseReg(signature, curId)));

              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              RegMask availableRegs = wd.availableRegs();
              if (availableRegs) {
                RegMask inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          RegType outType = var.out.regType();

          RegGroup group = archTraits.regTypeToGroup(outType);
          WorkData& wd = workData[group];

          if (outId == sa.id() && group == RegGroup::kGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}